

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Matcher<mp::obj::Type> * testing::A<mp::obj::Type>(void)

{
  void *__s;
  Matcher<mp::obj::Type> *in_RDI;
  MatcherInterface<mp::obj::Type> *in_stack_ffffffffffffffd8;
  Matcher<mp::obj::Type> *this;
  
  this = in_RDI;
  __s = operator_new(8);
  memset(__s,0,8);
  internal::AnyMatcherImpl<mp::obj::Type>::AnyMatcherImpl((AnyMatcherImpl<mp::obj::Type> *)this);
  MakeMatcher<mp::obj::Type>(in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }